

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall nlohmann::detail::input_adapter::input_adapter(input_adapter *this,istream *i)

{
  shared_ptr<nlohmann::detail::input_stream_adapter> local_28;
  istream *local_18;
  istream *i_local;
  input_adapter *this_local;
  
  local_18 = i;
  i_local = (istream *)this;
  std::make_shared<nlohmann::detail::input_stream_adapter,std::istream&>
            ((basic_istream<char,_std::char_traits<char>_> *)&local_28);
  std::shared_ptr<nlohmann::detail::input_adapter_protocol>::
  shared_ptr<nlohmann::detail::input_stream_adapter,void>(&this->ia,&local_28);
  std::shared_ptr<nlohmann::detail::input_stream_adapter>::~shared_ptr(&local_28);
  return;
}

Assistant:

input_adapter(std::istream& i)
: ia(std::make_shared<input_stream_adapter>(i)) {}